

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O2

int ComparePixelsLossy(uint32_t *src,int src_step,uint32_t *dst,int dst_step,int length,
                      int max_allowed_diff)

{
  int iVar1;
  
  while( true ) {
    if (length < 1) {
      return 1;
    }
    iVar1 = PixelsAreSimilar(*src,*dst,max_allowed_diff);
    if (iVar1 == 0) break;
    dst = dst + dst_step;
    src = src + src_step;
    length = length + -1;
  }
  return 0;
}

Assistant:

static WEBP_INLINE int ComparePixelsLossy(const uint32_t* src, int src_step,
                                          const uint32_t* dst, int dst_step,
                                          int length, int max_allowed_diff) {
  assert(length > 0);
  while (length-- > 0) {
    if (!PixelsAreSimilar(*src, *dst, max_allowed_diff)) {
      return 0;
    }
    src += src_step;
    dst += dst_step;
  }
  return 1;
}